

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsUtil.h
# Opt level: O2

bool __thiscall FileTree::findNode(FileTree *this,string *value,bool isFile,TreeNode **node_parent)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  TreeNode *pTVar6;
  ulong uVar7;
  TreeNode *pTVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string file;
  
  split(&files,value,'/');
  uVar2 = 0;
  pTVar8 = this->root->firstChild;
  do {
    uVar4 = uVar2;
    uVar7 = (long)files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar7 <= uVar4) break;
    std::__cxx11::string::string
              ((string *)&file,
               (string *)
               (files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar4));
    lVar5 = (long)files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    for (; pTVar8 != (TreeNode *)0x0; pTVar8 = pTVar8->nextSibling) {
      if (pTVar8->isFile == ((lVar5 >> 5) - 1U <= uVar4 && isFile)) {
        iVar3 = std::__cxx11::string::compare((string *)&file);
        if (iVar3 == 0) {
          *node_parent = pTVar8;
          pTVar6 = pTVar8->firstChild;
          goto LAB_00119b62;
        }
      }
    }
    pTVar6 = (TreeNode *)0x0;
LAB_00119b62:
    std::__cxx11::string::~string((string *)&file);
    bVar1 = pTVar8 != (TreeNode *)0x0;
    uVar2 = uVar4 + 1;
    pTVar8 = pTVar6;
  } while (bVar1 || pTVar6 != (TreeNode *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  return uVar7 <= uVar4;
}

Assistant:

bool findNode(const std::string value, bool isFile, TreeNode*& node_parent)
    {
        std::vector<std::string> files = split(value, '/');

        TreeNode* node = root->firstChild;

        bool isFound = true;


        for (int i = 0; i < files.size(); i++)
        {
            bool isBreakFromWhile = false;

            std::string file = files[i];

            bool _isFile = isFile;
            if (i < files.size() - 1)
            {
                _isFile = false;
            }

            while (node != nullptr)
            {
                if (node->isFile == _isFile && file.compare(node->value) == 0)
                {
                    node_parent = node;
                    node = node->firstChild;
                    isBreakFromWhile = true;
                    break;
                }
                node = node->nextSibling;
            }
            if (!isBreakFromWhile)
            {
                if (node == nullptr)
                {
                    isFound = false;
                    break;
                }
            }

        }
        return isFound;
    }